

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unity.c
# Opt level: O2

void UnityPrintNumberHex(_U_UINT number,char nibbles_to_print)

{
  uint uVar1;
  int __c;
  byte bVar2;
  
  bVar2 = nibbles_to_print * '\x04';
  while( true ) {
    bVar2 = bVar2 - 4;
    if (nibbles_to_print < '\x01') break;
    uVar1 = (uint)(number >> (bVar2 & 0x3f)) & 0xf;
    __c = uVar1 + 0x30;
    if (9 < uVar1) {
      __c = uVar1 + 0x37;
    }
    putchar(__c);
    nibbles_to_print = nibbles_to_print + -1;
  }
  return;
}

Assistant:

void UnityPrintNumberHex(const _U_UINT number, const char nibbles_to_print)
{
    _U_UINT nibble;
    char nibbles = nibbles_to_print;

    while (nibbles > 0)
    {
        nibble = (number >> (--nibbles << 2)) & 0x0000000F;
        if (nibble <= 9)
        {
            UNITY_OUTPUT_CHAR((char)('0' + nibble));
        }
        else
        {
            UNITY_OUTPUT_CHAR((char)('A' - 10 + nibble));
        }
    }
}